

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEvents.cpp
# Opt level: O2

void TTD::NSLogEvents::SnapshotEventLogEntry_Emit
               (EventLogEntry *evt,FileWriter *writer,ThreadContext *threadContext)

{
  SnapshotEventLogEntry *pSVar1;
  uint32 i;
  ulong uVar2;
  uint32 i_1;
  
  pSVar1 = GetInlineEventDataAs<TTD::NSLogEvents::SnapshotEventLogEntry,(TTD::NSLogEvents::EventKind)1>
                     (evt);
  FileWriter::WriteInt64(writer,restoreTime,pSVar1->RestoreTimestamp,CommaSeparator);
  FileWriter::WriteLengthValue(writer,pSVar1->LiveContextCount,CommaSeparator);
  FileWriter::WriteSequenceStart_DefaultKey(writer,CommaSeparator);
  for (uVar2 = 0; uVar2 < pSVar1->LiveContextCount; uVar2 = uVar2 + 1) {
    (*writer->_vptr_FileWriter[0x13])(writer,pSVar1->LiveContextIdArray[uVar2],(ulong)(uVar2 != 0));
  }
  (*writer->_vptr_FileWriter[5])(writer,0);
  FileWriter::WriteLengthValue(writer,pSVar1->LongLivedRefRootsCount,CommaSeparator);
  FileWriter::WriteSequenceStart_DefaultKey(writer,CommaSeparator);
  for (uVar2 = 0; uVar2 < pSVar1->LongLivedRefRootsCount; uVar2 = uVar2 + 1) {
    (*writer->_vptr_FileWriter[0x13])
              (writer,pSVar1->LongLivedRefRootsIdArray[uVar2],(ulong)(uVar2 != 0));
  }
  (*writer->_vptr_FileWriter[5])(writer,0);
  if (pSVar1->Snap != (SnapShot *)0x0) {
    SnapShot::EmitSnapshot(pSVar1->Snap,pSVar1->RestoreTimestamp,threadContext);
    return;
  }
  return;
}

Assistant:

void SnapshotEventLogEntry_Emit(const EventLogEntry* evt, FileWriter* writer, ThreadContext* threadContext)
        {
            const SnapshotEventLogEntry* snapEvt = GetInlineEventDataAs<SnapshotEventLogEntry, EventKind::SnapshotTag>(evt);

            writer->WriteInt64(NSTokens::Key::restoreTime, snapEvt->RestoreTimestamp, NSTokens::Separator::CommaSeparator);

            writer->WriteLengthValue(snapEvt->LiveContextCount, NSTokens::Separator::CommaSeparator);
            writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaSeparator);
            for(uint32 i = 0; i < snapEvt->LiveContextCount; ++i)
            {
                writer->WriteNakedLogTag(snapEvt->LiveContextIdArray[i], i != 0 ? NSTokens::Separator::CommaSeparator : NSTokens::Separator::NoSeparator);
            }
            writer->WriteSequenceEnd();

            writer->WriteLengthValue(snapEvt->LongLivedRefRootsCount, NSTokens::Separator::CommaSeparator);
            writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaSeparator);
            for(uint32 i = 0; i < snapEvt->LongLivedRefRootsCount; ++i)
            {
                writer->WriteNakedLogTag(snapEvt->LongLivedRefRootsIdArray[i], i != 0 ? NSTokens::Separator::CommaSeparator : NSTokens::Separator::NoSeparator);
            }
            writer->WriteSequenceEnd();

            if(snapEvt->Snap != nullptr)
            {
                snapEvt->Snap->EmitSnapshot(snapEvt->RestoreTimestamp, threadContext);
            }
        }